

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string sStack_38;
  
  ::std::__cxx11::string::string((string *)&sStack_38,(string *)fmt_str);
  Exception::ConstructMessage<std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&sStack_38,params);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}